

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.cpp
# Opt level: O2

size_t duckdb_zstd::ZSTD_compressBlock_lazy_dictMatchState
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  BYTE *iEnd;
  undefined8 *puVar1;
  ZSTD_matchState_t *pZVar2;
  undefined8 uVar3;
  seqStore_t *psVar4;
  U32 UVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  ulong uVar10;
  seqDef *psVar11;
  uint uVar12;
  BYTE *pBVar13;
  BYTE *pBVar14;
  BYTE *mEnd;
  int iVar15;
  BYTE *litEnd_1;
  int iVar16;
  int *piVar17;
  int *piVar18;
  BYTE *litEnd;
  int *iend;
  int *ip;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  int *ip_00;
  U32 local_e8;
  U32 local_e4;
  size_t ofbCandidate;
  ZSTD_matchState_t *local_d0;
  ulong local_c8;
  BYTE *local_c0;
  BYTE *local_b8;
  BYTE *local_b0;
  ulong local_a8;
  int *local_a0;
  int local_94;
  int local_90;
  int local_8c;
  BYTE *litLimit_w;
  BYTE *local_80;
  BYTE *local_78;
  BYTE *local_70;
  U32 *local_68;
  seqStore_t *local_60;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  int *local_40;
  ulong local_38;
  
  local_b8 = (ms->window).base;
  uVar7 = (ms->window).dictLimit;
  local_c8 = (ulong)uVar7;
  local_c0 = local_b8 + local_c8;
  uVar6 = (ms->cParams).minMatch;
  uVar12 = 6;
  if (uVar6 < 6) {
    uVar12 = uVar6;
  }
  uVar6 = 4;
  if (4 < uVar12) {
    uVar6 = uVar12;
  }
  pZVar2 = ms->dictMatchState;
  local_b0 = (pZVar2->window).nextSrc;
  local_78 = (pZVar2->window).base;
  local_70 = local_78 + (pZVar2->window).dictLimit;
  iVar16 = (int)local_b0;
  local_38 = (ulong)(((int)local_78 - iVar16) + uVar7);
  iVar15 = (int)local_b8;
  local_8c = (1 - uVar7) - iVar15;
  local_e8 = *rep;
  local_e4 = rep[1];
  ms->lazySkipping = 0;
  local_80 = local_78 + -local_38;
  iEnd = (BYTE *)((long)src + srcSize);
  local_a0 = (int *)((long)src + (srcSize - 8));
  litLimit_w = (BYTE *)((long)src + (srcSize - 0x20));
  local_94 = -iVar15;
  local_90 = (((iVar16 - uVar7) - (int)local_78) - iVar15) + 1;
  ip = (int *)((ulong)(((int)src - ((int)local_70 + (int)local_c0)) + iVar16 == 0) + (long)src);
  local_d0 = ms;
  local_60 = seqStore;
  do {
    while( true ) {
      pZVar2 = local_d0;
      if (local_a0 <= ip) {
        *rep = local_e8;
        rep[1] = local_e4;
        return (long)iEnd - (long)src;
      }
      iend = (int *)((long)ip + 1);
      iVar15 = (int)ip;
      uVar7 = ((iVar15 - (int)local_b8) - local_e8) + 1;
      piVar18 = (int *)(local_b8 + uVar7);
      if (uVar7 < (uint)local_c8) {
        piVar18 = (int *)(local_78 + (uVar7 - (int)local_38));
      }
      if ((uVar7 - (uint)local_c8 < 0xfffffffd) && (*piVar18 == *iend)) {
        pBVar13 = iEnd;
        if (uVar7 < (uint)local_c8) {
          pBVar13 = local_b0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + 5),(BYTE *)(piVar18 + 1),iEnd,pBVar13,local_c0);
        uVar20 = sVar8 + 4;
      }
      else {
        uVar20 = 0;
      }
      ofbCandidate = 999999999;
      if (uVar6 == 6) {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_6(pZVar2,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else if (uVar6 == 5) {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_5(pZVar2,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      else {
        uVar9 = ZSTD_HcFindBestMatch_dictMatchState_4(pZVar2,(BYTE *)ip,iEnd,&ofbCandidate);
      }
      uVar10 = uVar20;
      if (uVar20 < uVar9) {
        uVar10 = uVar9;
      }
      if (3 < uVar10) break;
      local_d0->lazySkipping = (uint)(0x7ff < (ulong)((long)ip - (long)src));
      ip = (int *)((long)ip + ((ulong)((long)ip - (long)src) >> 8) + 1);
    }
    uVar21 = 1;
    if (uVar20 < uVar9) {
      iend = ip;
      uVar21 = ofbCandidate;
    }
    local_48 = (ulong)((local_8c - local_e8) + iVar15);
    local_50 = (ulong)((local_94 - local_e8) + iVar15);
    local_58 = (ulong)((local_90 - local_e8) + iVar15);
    piVar18 = ip;
    local_68 = rep;
    for (lVar19 = 0; uVar20 = uVar10, (int *)(lVar19 + (long)ip) < local_a0; lVar19 = lVar19 + 1) {
      ip_00 = (int *)((long)ip + lVar19 + 1);
      iVar15 = (int)lVar19;
      uVar7 = (int)local_50 + iVar15 + 1;
      piVar17 = (int *)(local_b8 + uVar7);
      if (uVar7 < (uint)local_c8) {
        piVar17 = (int *)(local_78 + (uint)((int)local_58 + iVar15));
      }
      local_a8 = uVar21;
      local_40 = piVar18;
      if (((uint)((int)local_48 + iVar15) < 0xfffffffd) && (*piVar17 == *ip_00)) {
        pBVar13 = iEnd;
        if (uVar7 < (uint)local_c8) {
          pBVar13 = local_b0;
        }
        sVar8 = ZSTD_count_2segments
                          ((BYTE *)((long)ip + lVar19 + 5),(BYTE *)(piVar17 + 1),iEnd,pBVar13,
                           local_c0);
        if (sVar8 < 0xfffffffffffffffc) {
          uVar7 = 0x1f;
          if ((uint)local_a8 != 0) {
            for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
            }
          }
          if ((int)((uVar7 ^ 0x1f) + (int)uVar10 * 3 + -0x1e) < (int)(sVar8 + 4) * 3) {
            local_a8 = 1;
            uVar20 = sVar8 + 4;
            iend = ip_00;
          }
        }
      }
      ofbCandidate = 999999999;
      if (uVar6 == 6) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_6(local_d0,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else if (uVar6 == 5) {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_5(local_d0,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      else {
        uVar10 = ZSTD_HcFindBestMatch_dictMatchState_4(local_d0,(BYTE *)ip_00,iEnd,&ofbCandidate);
      }
      uVar21 = local_a8;
      if (uVar10 < 4) break;
      uVar7 = 0x1f;
      if ((uint)local_a8 != 0) {
        for (; (uint)local_a8 >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      iVar15 = 0x1f;
      if ((uint)ofbCandidate != 0) {
        for (; (uint)ofbCandidate >> iVar15 == 0; iVar15 = iVar15 + -1) {
        }
      }
      if ((int)uVar10 * 4 - iVar15 <= (int)((uVar7 ^ 0x1f) + (int)uVar20 * 4 + -0x1b)) break;
      piVar18 = (int *)((long)local_40 + 1);
      iend = piVar18;
      uVar21 = ofbCandidate;
    }
    psVar4 = local_60;
    if (3 < uVar21) {
      uVar9 = (long)iend + (-(long)local_b8 - uVar21) + -0xfffffffd;
      pBVar14 = local_b8;
      pBVar13 = local_c0;
      if ((uint)uVar9 < (uint)local_c8) {
        pBVar14 = local_80;
        pBVar13 = local_70;
      }
      pBVar14 = pBVar14 + (uVar9 & 0xffffffff);
      for (; ((src < iend && (pBVar13 < pBVar14)) && (*(BYTE *)((long)iend + -1) == pBVar14[-1]));
          iend = (int *)((long)iend + -1)) {
        pBVar14 = pBVar14 + -1;
        uVar20 = uVar20 + 1;
      }
      local_e4 = local_e8;
      local_e8 = (U32)uVar21 - 3;
    }
    uVar9 = (long)iend - (long)src;
    pBVar13 = local_60->lit;
    if (litLimit_w < iend) {
      ZSTD_safecopyLiterals(pBVar13,(BYTE *)src,(BYTE *)iend,litLimit_w);
LAB_01f6a52c:
      psVar4->lit = psVar4->lit + uVar9;
      psVar11 = psVar4->sequences;
      if (0xffff < uVar9) {
        psVar4->longLengthType = ZSTD_llt_literalLength;
        psVar4->longLengthPos = (U32)((ulong)((long)psVar11 - (long)psVar4->sequencesStart) >> 3);
      }
    }
    else {
      uVar3 = *(undefined8 *)((long)src + 8);
      *(undefined8 *)pBVar13 = *src;
      *(undefined8 *)(pBVar13 + 8) = uVar3;
      pBVar13 = local_60->lit;
      if (0x10 < uVar9) {
        uVar3 = *(undefined8 *)((long)src + 0x18);
        *(undefined8 *)(pBVar13 + 0x10) = *(undefined8 *)((long)src + 0x10);
        *(undefined8 *)(pBVar13 + 0x18) = uVar3;
        if (0x20 < (long)uVar9) {
          lVar19 = 0;
          do {
            puVar1 = (undefined8 *)((long)src + lVar19 + 0x20);
            uVar3 = puVar1[1];
            pBVar14 = pBVar13 + lVar19 + 0x20;
            *(undefined8 *)pBVar14 = *puVar1;
            *(undefined8 *)(pBVar14 + 8) = uVar3;
            puVar1 = (undefined8 *)((long)src + lVar19 + 0x30);
            uVar3 = puVar1[1];
            *(undefined8 *)(pBVar14 + 0x10) = *puVar1;
            *(undefined8 *)(pBVar14 + 0x18) = uVar3;
            lVar19 = lVar19 + 0x20;
          } while (pBVar14 + 0x20 < pBVar13 + uVar9);
        }
        goto LAB_01f6a52c;
      }
      local_60->lit = pBVar13 + uVar9;
      psVar11 = local_60->sequences;
    }
    rep = local_68;
    pBVar13 = litLimit_w;
    psVar11->litLength = (U16)uVar9;
    psVar11->offBase = (U32)uVar21;
    if (0xffff < uVar20 - 3) {
      psVar4->longLengthType = ZSTD_llt_matchLength;
      psVar4->longLengthPos = (U32)((ulong)((long)psVar11 - (long)psVar4->sequencesStart) >> 3);
    }
    psVar11->mlBase = (U16)(uVar20 - 3);
    psVar4->sequences = psVar11 + 1;
    if (local_d0->lazySkipping != 0) {
      local_d0->lazySkipping = 0;
    }
    UVar5 = local_e4;
    for (src = (void *)((long)iend + uVar20); local_e4 = UVar5, ip = (int *)src, src <= local_a0;
        src = (void *)((long)src + sVar8 + 4)) {
      uVar7 = ((int)src - (int)local_b8) - local_e4;
      pBVar14 = local_b8;
      if (uVar7 < (uint)local_c8) {
        pBVar14 = local_80;
      }
      if ((0xfffffffc < uVar7 - (uint)local_c8) || (*(int *)(pBVar14 + uVar7) != *src)) break;
      mEnd = iEnd;
      if (uVar7 < (uint)local_c8) {
        mEnd = local_b0;
      }
      sVar8 = ZSTD_count_2segments
                        ((BYTE *)((long)src + 4),(BYTE *)((long)(pBVar14 + uVar7) + 4),iEnd,mEnd,
                         local_c0);
      pBVar14 = psVar4->lit;
      if (pBVar13 < src) {
        ZSTD_safecopyLiterals(pBVar14,(BYTE *)src,(BYTE *)src,pBVar13);
      }
      else {
        uVar3 = *(undefined8 *)((long)src + 8);
        *(undefined8 *)pBVar14 = *src;
        *(undefined8 *)(pBVar14 + 8) = uVar3;
      }
      psVar11 = psVar4->sequences;
      psVar11->litLength = 0;
      psVar11->offBase = 1;
      if (0xffff < sVar8 + 1) {
        psVar4->longLengthType = ZSTD_llt_matchLength;
        psVar4->longLengthPos = (U32)((ulong)((long)psVar11 - (long)psVar4->sequencesStart) >> 3);
      }
      psVar11->mlBase = (U16)(sVar8 + 1);
      psVar4->sequences = psVar11 + 1;
      UVar5 = local_e8;
      local_e8 = local_e4;
    }
  } while( true );
}

Assistant:

size_t ZSTD_compressBlock_lazy_dictMatchState(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)
{
    return ZSTD_compressBlock_lazy_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1, ZSTD_dictMatchState);
}